

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::RoundEvenCaseInstance::compare
          (RoundEvenCaseInstance *this,void **inputs,void **outputs)

{
  float a;
  bool bVar1;
  int numAccurateBits;
  deUint32 value;
  deUint32 dVar2;
  const_reference pvVar3;
  ostream *poVar4;
  Hex<8UL> HVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  deUint32 local_9c;
  int local_80;
  deUint32 ulpDiff_1;
  int roundedVal;
  bool anyOk;
  int maxRes;
  int minRes;
  float out0_1;
  float in0_1;
  int compNdx_1;
  float eps;
  deUint32 maxUlpDiff;
  int mantissaBits;
  HexFloat local_50;
  deUint32 local_4c;
  float local_48;
  deUint32 ulpDiff;
  float ref;
  float out0;
  float in0;
  int compNdx;
  int scalarSize;
  DataType DStack_2c;
  bool hasSignedZero;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  RoundEvenCaseInstance *this_local;
  
  _precision = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar3 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_CommonFunctionTestInstance).m_spec.inputs,0);
  DStack_2c = glu::VarType::getBasicType(&pvVar3->varType);
  pvVar3 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_CommonFunctionTestInstance).m_spec.inputs,0);
  scalarSize = glu::VarType::getPrecision(&pvVar3->varType);
  compNdx._3_1_ = supportsSignedZero(scalarSize);
  in0 = (float)glu::getDataTypeScalarSize(DStack_2c);
  if ((scalarSize == 2) || (scalarSize == 1)) {
    for (out0 = 0.0; (int)out0 < (int)in0; out0 = (float)((int)out0 + 1)) {
      ref = *(float *)((long)*outputs_local + (long)(int)out0 * 4);
      ulpDiff = *(deUint32 *)((long)*_precision + (long)(int)out0 * 4);
      local_48 = roundEven(ref);
      if ((compNdx._3_1_ & 1) == 0) {
        local_9c = getUlpDiffIgnoreZeroSign((float)ulpDiff,local_48);
      }
      else {
        local_9c = getUlpDiff((float)ulpDiff,local_48);
      }
      local_4c = local_9c;
      if (local_9c != 0) {
        poVar4 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                                 "Expected [");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)out0);
        poVar4 = std::operator<<(poVar4,"] = ");
        HexFloat::HexFloat(&local_50,local_48);
        poVar4 = anon_unknown_0::operator<<(poVar4,&local_50);
        poVar4 = std::operator<<(poVar4,", got ULP diff ");
        HVar5 = tcu::toHex<unsigned_int>(local_4c);
        tcu::Format::operator<<(poVar4,HVar5);
        return false;
      }
    }
  }
  else {
    numAccurateBits = getMinMantissaBits(scalarSize);
    value = getMaxUlpDiffFromBits(numAccurateBits);
    fVar6 = getEpsFromBits(1.0,numAccurateBits);
    for (out0_1 = 0.0; (int)out0_1 < (int)in0; out0_1 = (float)((int)out0_1 + 1)) {
      fVar8 = *(float *)((long)*outputs_local + (long)(int)out0_1 * 4);
      a = *(float *)((long)*_precision + (long)(int)out0_1 * 4);
      fVar7 = roundEven(fVar8 - fVar6);
      fVar8 = roundEven(fVar8 + fVar6);
      bVar1 = false;
      for (local_80 = (int)fVar7; local_80 <= (int)fVar8; local_80 = local_80 + 1) {
        dVar2 = getUlpDiffIgnoreZeroSign(a,(float)local_80);
        if (dVar2 <= value) {
          bVar1 = true;
          break;
        }
      }
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                                 "Expected [");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)out0_1);
        poVar4 = std::operator<<(poVar4,"] = [");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)fVar7);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)fVar8);
        poVar4 = std::operator<<(poVar4,"] with ULP threshold ");
        HVar5 = tcu::toHex<unsigned_int>(value);
        tcu::Format::operator<<(poVar4,HVar5);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasSignedZero	= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact rounding result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= roundEven(in0);

				const deUint32	ulpDiff		= hasSignedZero ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(roundEven(in0-eps));
				const int		maxRes		= int(roundEven(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}